

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::SpecparamDeclarationSyntax::SpecparamDeclarationSyntax
          (SpecparamDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          ImplicitTypeSyntax *type,
          SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *declarators,Token semi)

{
  bool bVar1;
  ImplicitTypeSyntax *pIVar2;
  SpecparamDeclaratorSyntax *pSVar3;
  size_t in_RCX;
  SyntaxNode *in_RDX;
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *in_RDI;
  ImplicitTypeSyntax *in_R8;
  SpecparamDeclaratorSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *rhs;
  undefined1 in_stack_ffffffffffffffb0 [16];
  MemberSyntax *in_stack_ffffffffffffffc0;
  ImplicitTypeSyntax *local_38 [2];
  ImplicitTypeSyntax *local_28;
  SyntaxNode *local_10;
  size_t local_8;
  
  rhs = (SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *)&stack0x00000008;
  local_28 = in_R8;
  local_10 = in_RDX;
  local_8 = in_RCX;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0._12_4_,
             in_stack_ffffffffffffffb0._0_8_);
  in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode = local_10;
  in_RDI[1].super_SyntaxListBase.childCount = local_8;
  local_38[0] = local_28;
  not_null<slang::syntax::ImplicitTypeSyntax_*>::not_null<slang::syntax::ImplicitTypeSyntax_*>
            ((not_null<slang::syntax::ImplicitTypeSyntax_*> *)&in_RDI[1].elements,local_38);
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::SeparatedSyntaxList(in_RDI,rhs);
  in_RDI[2].elements._M_extent._M_extent_value =
       (size_t)(rhs->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[3].super_SyntaxListBase._vptr_SyntaxListBase =
       *(_func_int ***)&(rhs->super_SyntaxListBase).super_SyntaxNode;
  pIVar2 = not_null<slang::syntax::ImplicitTypeSyntax_*>::operator->
                     ((not_null<slang::syntax::ImplicitTypeSyntax_*> *)0x7a64b0);
  (pIVar2->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent =
       (SyntaxNode *)in_RDI;
  *(SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> **)
   &in_RDI[2].super_SyntaxListBase.super_SyntaxNode = in_RDI;
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *)0x7a64d3);
  SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::end(in_RDI);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*>_>
                      ((self_type *)in_RDI,
                       (iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*> *)rhs);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pSVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*>,_false>
                          *)0x7a6512);
    (pSVar3->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::iterator_base<slang::syntax::SpecparamDeclaratorSyntax_*>,_false>
                *)in_RDI);
  }
  return;
}

Assistant:

SpecparamDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, ImplicitTypeSyntax& type, const SeparatedSyntaxList<SpecparamDeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::SpecparamDeclaration, attributes), keyword(keyword), type(&type), declarators(declarators), semi(semi) {
        this->type->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }